

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O0

void QComboBoxPrivateScroller::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QComboBoxPrivateScroller *_t;
  int in_stack_ffffffffffffffcc;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    doScroll((QComboBoxPrivateScroller *)0x53e9fa,in_stack_ffffffffffffffcc);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QComboBoxPrivateScroller::*)(int)>
              (in_RCX,(void **)doScroll,0,0);
  }
  return;
}

Assistant:

void QComboBoxPrivateScroller::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateScroller *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->doScroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateScroller::*)(int )>(_a, &QComboBoxPrivateScroller::doScroll, 0))
            return;
    }
}